

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcMessage::parse(MpRpcMessage *this,char *utf8_buf,size_t len)

{
  msgpack_object *pmVar1;
  msgpack_object *pmVar2;
  uint *puVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  bool bVar6;
  msgpack_unpack_return mVar7;
  int iVar8;
  MpRpcMessage *pMVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  shared_ptr<mprpc::MpRpcMessage> sVar14;
  string str;
  MpRpcMessage *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  MpRpcMessage *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68 = (MpRpcMessage *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mprpc::MpRpcMessage,std::allocator<mprpc::MpRpcMessage>>
            (&local_60,&local_68,(allocator<mprpc::MpRpcMessage> *)local_50);
  if (*utf8_buf == 'S') {
    bVar6 = snappy::Uncompress(utf8_buf + 5,len - 5,&local_68->_recv_data);
    _Var10._M_pi = extraout_RDX;
    if (bVar6) goto LAB_00137bb7;
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&local_68->_recv_data,0,(char *)(local_68->_recv_data)._M_string_length,
               (ulong)utf8_buf);
LAB_00137bb7:
    mVar7 = msgpack_unpack((local_68->_recv_data)._M_dataplus._M_p,
                           (local_68->_recv_data)._M_string_length,(size_t *)0x0,&local_68->mp_zone,
                           &local_68->root);
    _Var10._M_pi = extraout_RDX_00;
    if ((mVar7 == MSGPACK_UNPACK_SUCCESS) && ((local_68->root).type == MSGPACK_OBJECT_MAP)) {
      pMVar9 = local_68;
      local_58 = this;
      if ((local_68->root).via.array.size != 0) {
        uVar12 = 0;
        do {
          pmVar1 = (pMVar9->root).via.array.ptr;
          if (pmVar1[uVar12 * 2].type == MSGPACK_OBJECT_STR) {
            pmVar2 = pmVar1[uVar12 * 2].via.array.ptr;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,pmVar2,
                       (long)&pmVar2->type + (ulong)pmVar1[uVar12 * 2].via.array.size);
            iVar8 = std::__cxx11::string::compare((char *)local_50);
            if (iVar8 == 0) {
              _Var10._M_pi = extraout_RDX_01;
              if ((pmVar1[uVar12 * 2 + 1].type == MSGPACK_OBJECT_POSITIVE_INTEGER) ||
                 (pmVar1[uVar12 * 2 + 1].type == MSGPACK_OBJECT_NEGATIVE_INTEGER)) {
                local_68->id = pmVar1[uVar12 * 2 + 1].via.array.size;
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_50);
              if (iVar8 == 0) {
                _Var10._M_pi = extraout_RDX_02;
                if (pmVar1[uVar12 * 2 + 1].type == MSGPACK_OBJECT_STR) {
                  std::__cxx11::string::_M_replace
                            ((ulong)local_68,0,(char *)(local_68->method)._M_string_length,
                             (ulong)pmVar1[uVar12 * 2 + 1].via.array.ptr);
                  _Var10._M_pi = extraout_RDX_07;
                }
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)local_50);
                if (iVar8 == 0) {
                  (local_68->params).via.array.ptr = pmVar1[uVar12 * 2 + 1].via.array.ptr;
                  uVar5 = *(undefined4 *)&pmVar1[uVar12 * 2 + 1].field_0x4;
                  uVar4 = pmVar1[uVar12 * 2 + 1].via.u64;
                  (local_68->params).type = pmVar1[uVar12 * 2 + 1].type;
                  *(undefined4 *)&(local_68->params).field_0x4 = uVar5;
                  (local_68->params).via.u64 = uVar4;
                  _Var10._M_pi = extraout_RDX_03;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar8 == 0) {
                    (local_68->result).via.array.ptr = pmVar1[uVar12 * 2 + 1].via.array.ptr;
                    uVar5 = *(undefined4 *)&pmVar1[uVar12 * 2 + 1].field_0x4;
                    uVar4 = pmVar1[uVar12 * 2 + 1].via.u64;
                    (local_68->result).type = pmVar1[uVar12 * 2 + 1].type;
                    *(undefined4 *)&(local_68->result).field_0x4 = uVar5;
                    (local_68->result).via.u64 = uVar4;
                    _Var10._M_pi = extraout_RDX_04;
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)local_50);
                    _Var10._M_pi = extraout_RDX_05;
                    if (((iVar8 == 0) && (pmVar1[uVar12 * 2 + 1].type == MSGPACK_OBJECT_MAP)) &&
                       (pmVar1[uVar12 * 2 + 1].via.array.size != 0)) {
                      lVar13 = 0x28;
                      uVar11 = 0;
                      do {
                        pmVar2 = pmVar1[uVar12 * 2 + 1].via.array.ptr;
                        if (*(int *)((long)pmVar2 + lVar13 + -0x28) == 5) {
                          puVar3 = *(uint **)((long)&pmVar2[-1].type + lVar13);
                          if (*puVar3 == 0x65646f63) {
                            if ((*(uint *)((long)pmVar2 + lVar13 + -0x10) & 0xfffffffe) == 2) {
                              local_68->err_code = *(int *)((long)pmVar2 + lVar13 + -8);
                            }
                          }
                          else {
                            _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           (ulong)(*puVar3 ^ 0x7373656d);
                            if ((*(int *)((long)puVar3 + 3) == 0x65676173 &&
                                 (*puVar3 ^ 0x7373656d) == 0) &&
                               (*(int *)((long)pmVar2 + lVar13 + -0x10) == 5)) {
                              std::__cxx11::string::_M_replace
                                        ((ulong)&local_68->err_msg,0,
                                         (char *)(local_68->err_msg)._M_string_length,
                                         *(ulong *)((long)&pmVar2->type + lVar13));
                              _Var10._M_pi = extraout_RDX_06;
                            }
                          }
                        }
                        uVar11 = uVar11 + 1;
                        lVar13 = lVar13 + 0x30;
                      } while (uVar11 < pmVar1[uVar12 * 2 + 1].via.array.size);
                    }
                  }
                }
              }
            }
            pMVar9 = local_68;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
              pMVar9 = local_68;
              _Var10._M_pi = extraout_RDX_08;
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (pMVar9->root).via.array.size);
      }
      (local_58->method)._M_dataplus._M_p = (pointer)pMVar9;
      (local_58->method)._M_string_length = (size_type)local_60._M_pi;
      this = local_58;
      goto LAB_00137e35;
    }
  }
  (this->method)._M_dataplus._M_p = (pointer)0x0;
  (this->method)._M_string_length = 0;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    _Var10._M_pi = extraout_RDX_09;
  }
LAB_00137e35:
  sVar14.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  sVar14.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar14.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcMessage::parse(const char* utf8_buf, size_t len)
    {
        auto rpcmsg = make_shared<MpRpcMessage>();

        try {
            if (utf8_buf[0] == 'S') {
                //uint32_t orig_len = *(uint32_t*)(utf8_buf + 1);
                if (!snappy::Uncompress(utf8_buf + 5, len - 5, &rpcmsg->_recv_data))
                    return nullptr;
            }
            else {
                rpcmsg->_recv_data.assign(utf8_buf, len);
            }
            msgpack_unpack_return ret = msgpack_unpack(rpcmsg->_recv_data.c_str(), rpcmsg->_recv_data.size(),
                                                       nullptr, &rpcmsg->mp_zone, &rpcmsg->root);
            if ( ret != MSGPACK_UNPACK_SUCCESS)
                return nullptr;

            if (!is_map(rpcmsg->root)) return nullptr;

            for (uint32_t i = 0; i < rpcmsg->root.via.map.size; i++) {
                auto o = rpcmsg->root.via.map.ptr + i;
                if (o->key.type != MSGPACK_OBJECT_STR) continue;
                const string str(o->key.via.str.ptr, o->key.via.str.size);
                if (str == "id") {
                    if (o->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.i64;
                    else if (o->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.u64;
                }
                else if (str == "method") {
                    if (o->val.type == MSGPACK_OBJECT_STR)
                        rpcmsg->method.assign(o->val.via.str.ptr, o->val.via.str.size);
                }
                else if (str == "params") {
                    rpcmsg->params = o->val;
                }
                else if (str == "result") {
                    rpcmsg->result = o->val;
                }
                else if (str == "error") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "code", 4) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.i64;
                                else if (p->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.u64;
                            }
                            else if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "message", 7) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_STR)
                                    rpcmsg->err_msg.assign(p->val.via.str.ptr, p->val.via.str.size);
                            }
                        }
                    }
                }
#if 0
                else if (str == "debug") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        uint64_t recv_time = 0;
                        uint64_t send_time = 0;
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR) {
                                if (memcmp(p->key.via.str.ptr, "recv_time", 9) == 0)
                                    recv_time = p->val.via.u64;
                                else if (memcmp(p->key.via.str.ptr, "send_time", 9) == 0)
                                    send_time = p->val.via.u64;
                            }
                        }
                        std::cout << "rsp_time: " << rpcmsg->method << " "
                            << (send_time - recv_time) << " "
                            << time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count() - recv_time
                            << endl;
                    }
                }
#endif
            }
            return rpcmsg;
        }
        catch (exception& e) {
            cerr << "parse conf failure: " << e.what();
            return nullptr;
        }
    }